

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# video_reader.c
# Opt level: O0

AvxVideoReader * aom_video_reader_open(char *filename)

{
  int iVar1;
  AvxInputContext *in_RDI;
  FILE *file;
  _Bool using_file;
  AvxVideoReader *reader;
  ObuDecInputContext *in_stack_00000068;
  AvxInputContext *in_stack_000000c0;
  WebmInputContext *in_stack_000000c8;
  FILE *local_30;
  AvxVideoReader *local_8;
  
  iVar1 = strcmp((char *)in_RDI,"-");
  if (iVar1 == 0) {
    local_30 = (FILE *)set_binary_mode(_stdin);
  }
  else {
    local_30 = fopen64((char *)in_RDI,"rb");
  }
  if (local_30 == (FILE *)0x0) {
    local_8 = (AvxVideoReader *)0x0;
  }
  else {
    local_8 = (AvxVideoReader *)calloc(1,0x1b8);
    if (local_8 == (AvxVideoReader *)0x0) {
      fclose(local_30);
      local_8 = (AvxVideoReader *)0x0;
    }
    else {
      (local_8->input_ctx).filename = (char *)in_RDI;
      (local_8->input_ctx).file = (FILE *)local_30;
      (local_8->obu_ctx).avx_ctx = &local_8->input_ctx;
      (local_8->obu_ctx).is_annexb = 1;
      if ((iVar1 == 0) || (iVar1 = file_is_webm(in_stack_000000c8,in_stack_000000c0), iVar1 == 0)) {
        iVar1 = file_is_ivf(in_RDI);
        if (iVar1 == 0) {
          iVar1 = file_is_obu(in_stack_00000068);
          if (iVar1 == 0) {
            fclose(local_30);
            free(local_8);
            local_8 = (AvxVideoReader *)0x0;
          }
          else {
            (local_8->input_ctx).file_type = FILE_TYPE_OBU;
            (local_8->info).codec_fourcc = 0x31305641;
            (local_8->info).is_annexb = (local_8->obu_ctx).is_annexb;
          }
        }
        else {
          (local_8->input_ctx).file_type = FILE_TYPE_IVF;
          (local_8->info).codec_fourcc = (local_8->input_ctx).fourcc;
          (local_8->info).frame_width = (local_8->input_ctx).width;
          (local_8->info).frame_height = (local_8->input_ctx).height;
        }
      }
      else {
        (local_8->input_ctx).file_type = FILE_TYPE_WEBM;
        (local_8->info).codec_fourcc = (local_8->input_ctx).fourcc;
        (local_8->info).frame_width = (local_8->input_ctx).width;
        (local_8->info).frame_height = (local_8->input_ctx).height;
      }
    }
  }
  return local_8;
}

Assistant:

AvxVideoReader *aom_video_reader_open(const char *filename) {
  AvxVideoReader *reader = NULL;
  const bool using_file = strcmp(filename, "-") != 0;
  FILE *const file =
      using_file ? fopen(filename, "rb") : set_binary_mode(stdin);
  if (!file) return NULL;  // Can't open file

  reader = (AvxVideoReader *)calloc(1, sizeof(*reader));
  if (!reader) {
    fclose(file);
    return NULL;  // Can't allocate AvxVideoReader
  }

  reader->input_ctx.filename = filename;
  reader->input_ctx.file = file;
  reader->obu_ctx.avx_ctx = &reader->input_ctx;
  reader->obu_ctx.is_annexb = 1;

  // TODO(https://crbug.com/aomedia/1706): webm type does not support reading
  // from stdin yet, and file_is_webm is not using the detect buffer when
  // determining the type. Therefore it should only be checked when using a file
  // and needs to be checked prior to other types.
  if (false) {
#if CONFIG_WEBM_IO
  } else if (using_file &&
             file_is_webm(&reader->webm_ctx, &reader->input_ctx)) {
    reader->input_ctx.file_type = FILE_TYPE_WEBM;
    reader->info.codec_fourcc = reader->input_ctx.fourcc;
    reader->info.frame_width = reader->input_ctx.width;
    reader->info.frame_height = reader->input_ctx.height;
#endif
  } else if (file_is_ivf(&reader->input_ctx)) {
    reader->input_ctx.file_type = FILE_TYPE_IVF;
    reader->info.codec_fourcc = reader->input_ctx.fourcc;
    reader->info.frame_width = reader->input_ctx.width;
    reader->info.frame_height = reader->input_ctx.height;
  } else if (file_is_obu(&reader->obu_ctx)) {
    reader->input_ctx.file_type = FILE_TYPE_OBU;
    // assume AV1
    reader->info.codec_fourcc = AV1_FOURCC;
    reader->info.is_annexb = reader->obu_ctx.is_annexb;
  } else {
    fclose(file);
    free(reader);
    return NULL;  // Unknown file type
  }

  return reader;
}